

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pm_column_tests.h
# Opt level: O1

void column_test_row_access_constructors<Gudhi::persistence_matrix::Intrusive_set_column<Column_mini_matrix<Base_col_options<true,(Gudhi::persistence_matrix::Column_types)8,true,false,true>>>,std::vector<boost::intrusive::list<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,(Gudhi::persistence_matrix::Column_types)8,true,false,true>>>,boost::intrusive::constant_time_size<false>,boost::intrusive::base_hook<boost::intrusive::list_base_hook<boost::intrusive::tag<Column_mini_matrix<Base_col_options<true,(Gudhi::persistence_matrix::Column_types)8,true,false,true>>::Matrix_row_tag>,boost::intrusive::link_mode<(boost::intrusive::link_mode_type)2>>>>,std::allocator<boost::intrusive::list<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,(Gudhi::persistence_matrix::Column_types)8,true,false,true>>>,boost::intrusive::constant_time_size<false>,boost::intrusive::base_hook<boost::intrusive::list_base_hook<boost::intrusive::tag<Column_mini_matrix<Base_col_options<true,(Gudhi::persistence_matrix::Column_types)8,true,false,true>>::Matrix_row_tag>,boost::intrusive::link_mode<(boost::intrusive::link_mode_type)2>>>>>>>
               (vector<Gudhi::persistence_matrix::Intrusive_set_column<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)8,_true,_false,_true>_>_>,_std::allocator<Gudhi::persistence_matrix::Intrusive_set_column<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)8,_true,_false,_true>_>_>_>_>
                *matrix,vector<boost::intrusive::list<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)8,_true,_false,_true>_>_>,_boost::intrusive::constant_time_size<false>,_boost::intrusive::base_hook<boost::intrusive::list_base_hook<boost::intrusive::tag<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)8,_true,_false,_true>_>::Matrix_row_tag>,_boost::intrusive::link_mode<(boost::intrusive::link_mode_type)2>_>_>_>,_std::allocator<boost::intrusive::list<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)8,_true,_false,_true>_>_>,_boost::intrusive::constant_time_size<false>,_boost::intrusive::base_hook<boost::intrusive::list_base_hook<boost::intrusive::tag<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)8,_true,_false,_true>_>::Matrix_row_tag>,_boost::intrusive::link_mode<(boost::intrusive::link_mode_type)2>_>_>_>_>_>
                        *rows)

{
  uint uVar1;
  int iVar2;
  pointer plVar3;
  node_ptr plVar4;
  Index IVar5;
  node_ptr prVar6;
  bool bVar7;
  node_ptr prVar8;
  list<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)8,_true,_false,_true>_>_>,_boost::intrusive::constant_time_size<false>,_boost::intrusive::base_hook<boost::intrusive::list_base_hook<boost::intrusive::tag<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)8,_true,_false,_true>_>::Matrix_row_tag>,_boost::intrusive::link_mode<(boost::intrusive::link_mode_type)2>_>_>_>
  *r;
  list<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)8,_true,_false,_true>_>_>,_boost::intrusive::constant_time_size<false>,_boost::intrusive::base_hook<boost::intrusive::list_base_hook<boost::intrusive::tag<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)8,_true,_false,_true>_>::Matrix_row_tag>,_boost::intrusive::link_mode<(boost::intrusive::link_mode_type)2>_>_>_>
  *r_1;
  node_ptr plVar9;
  undefined4 local_2a4;
  undefined *local_2a0;
  undefined4 *local_298;
  undefined **local_290;
  undefined **local_288;
  char *local_280;
  shared_count sStack_278;
  char *local_270;
  node_disposer<Gudhi::persistence_matrix::Intrusive_set_column<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)8,_true,_false,_true>_>_>::Delete_disposer,_boost::intrusive::bhtraits<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)8,_true,_false,_true>_>_>,_boost::intrusive::rbtree_node_traits<void_*,_false>,_(boost::intrusive::link_mode_type)1,_Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)8,_true,_false,_true>_>::Matrix_column_tag,_3U>,_(boost::intrusive::algo_types)5>
  local_268;
  undefined8 *local_258;
  undefined ***local_250;
  undefined **local_248;
  ulong local_240;
  shared_count sStack_238;
  undefined4 **local_230;
  char *local_228;
  char *local_220;
  shared_count sStack_218;
  undefined1 local_210 [16];
  undefined1 local_200 [16];
  node_ptr local_1f0;
  _Base_ptr p_Stack_1e8;
  _Base_ptr p_Stack_1e0;
  undefined8 local_1d0;
  Entry_constructor *pEStack_1c8;
  undefined1 local_1c0 [16];
  node_ptr local_1b0;
  undefined8 uStack_1a8;
  rbtree_node<void_*> local_1a0;
  vector<boost::intrusive::list<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)8,_true,_false,_true>_>_>,_boost::intrusive::constant_time_size<false>,_boost::intrusive::base_hook<boost::intrusive::list_base_hook<boost::intrusive::tag<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)8,_true,_false,_true>_>::Matrix_row_tag>,_boost::intrusive::link_mode<(boost::intrusive::link_mode_type)2>_>_>_>,_std::allocator<boost::intrusive::list<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)8,_true,_false,_true>_>_>,_boost::intrusive::constant_time_size<false>,_boost::intrusive::base_hook<boost::intrusive::list_base_hook<boost::intrusive::tag<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)8,_true,_false,_true>_>::Matrix_row_tag>,_boost::intrusive::link_mode<(boost::intrusive::link_mode_type)2>_>_>_>_>_>
  *local_180;
  vector<Gudhi::persistence_matrix::Intrusive_set_column<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)8,_true,_false,_true>_>_>,_std::allocator<Gudhi::persistence_matrix::Intrusive_set_column<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)8,_true,_false,_true>_>_>_>_>
  *local_178;
  undefined1 *local_170;
  undefined1 *local_168;
  char *local_160;
  char *local_158;
  undefined1 *local_150;
  undefined1 *local_148;
  char *local_140;
  char *local_138;
  undefined1 *local_130;
  undefined1 *local_128;
  char *local_120;
  char *local_118;
  char *local_110;
  char *local_108;
  undefined1 *local_100;
  undefined1 *local_f8;
  char *local_f0;
  char *local_e8;
  undefined1 *local_e0;
  undefined1 *local_d8;
  char *local_d0;
  char *local_c8;
  undefined1 *local_c0;
  undefined1 *local_b8;
  char *local_b0;
  char *local_a8;
  char *local_a0;
  char *local_98;
  undefined1 *local_90;
  undefined1 *local_88;
  char *local_80;
  char *local_78;
  undefined1 *local_70;
  undefined1 *local_68;
  char *local_60;
  char *local_58;
  undefined1 *local_50;
  undefined1 *local_48;
  char *local_40;
  char *local_38;
  
  build_rows<Gudhi::persistence_matrix::Intrusive_set_column<Column_mini_matrix<Base_col_options<true,(Gudhi::persistence_matrix::Column_types)8,true,false,true>>>>
            ();
  get_ordered_rows<Gudhi::persistence_matrix::Intrusive_set_column<Column_mini_matrix<Base_col_options<true,(Gudhi::persistence_matrix::Column_types)8,true,false,true>>>>
            ((vector<std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>,_std::allocator<std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>_>_>
              *)local_1c0,matrix);
  test_matrix_equality<Gudhi::persistence_matrix::Intrusive_set_column<Column_mini_matrix<Base_col_options<true,(Gudhi::persistence_matrix::Column_types)8,true,false,true>>>>
            ((vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
              *)local_200,
             (vector<std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>,_std::allocator<std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>_>_>
              *)local_1c0);
  std::
  vector<std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>,_std::allocator<std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>_>_>
  ::~vector((vector<std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>,_std::allocator<std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>_>_>
             *)local_1c0);
  std::
  vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  ::~vector((vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
             *)local_200);
  build_column_values<Gudhi::persistence_matrix::Intrusive_set_column<Column_mini_matrix<Base_col_options<true,(Gudhi::persistence_matrix::Column_types)8,true,false,true>>>>
            ();
  get_ordered_column_contents<Gudhi::persistence_matrix::Intrusive_set_column<Column_mini_matrix<Base_col_options<true,(Gudhi::persistence_matrix::Column_types)8,true,false,true>>>>
            ((vector<std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>,_std::allocator<std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>_>_>
              *)local_1c0,matrix);
  test_matrix_equality<Gudhi::persistence_matrix::Intrusive_set_column<Column_mini_matrix<Base_col_options<true,(Gudhi::persistence_matrix::Column_types)8,true,false,true>>>>
            ((vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
              *)local_200,
             (vector<std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>,_std::allocator<std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>_>_>
              *)local_1c0);
  std::
  vector<std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>,_std::allocator<std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>_>_>
  ::~vector((vector<std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>,_std::allocator<std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>_>_>
             *)local_1c0);
  std::
  vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  ::~vector((vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
             *)local_200);
  local_178 = matrix;
  Gudhi::persistence_matrix::
  Intrusive_set_column<Column_mini_matrix<Base_col_options<true,(Gudhi::persistence_matrix::Column_types)8,true,false,true>>>
  ::
  Intrusive_set_column<std::vector<boost::intrusive::list<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,(Gudhi::persistence_matrix::Column_types)8,true,false,true>>>,boost::intrusive::constant_time_size<false>,boost::intrusive::base_hook<boost::intrusive::list_base_hook<boost::intrusive::tag<Column_mini_matrix<Base_col_options<true,(Gudhi::persistence_matrix::Column_types)8,true,false,true>>::Matrix_row_tag>,boost::intrusive::link_mode<(boost::intrusive::link_mode_type)2>>>>,std::allocator<boost::intrusive::list<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,(Gudhi::persistence_matrix::Column_types)8,true,false,true>>>,boost::intrusive::constant_time_size<false>,boost::intrusive::base_hook<boost::intrusive::list_base_hook<boost::intrusive::tag<Column_mini_matrix<Base_col_options<true,(Gudhi::persistence_matrix::Column_types)8,true,false,true>>::Matrix_row_tag>,boost::intrusive::link_mode<(boost::intrusive::link_mode_type)2>>>>>>>
            ((Intrusive_set_column<Column_mini_matrix<Base_col_options<true,(Gudhi::persistence_matrix::Column_types)8,true,false,true>>>
              *)local_200,
             (matrix->
             super__Vector_base<Gudhi::persistence_matrix::Intrusive_set_column<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)8,_true,_false,_true>_>_>,_std::allocator<Gudhi::persistence_matrix::Intrusive_set_column<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)8,_true,_false,_true>_>_>_>_>
             )._M_impl.super__Vector_impl_data._M_start,6,rows,(Column_settings *)0x0);
  plVar3 = (rows->
           super__Vector_base<boost::intrusive::list<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)8,_true,_false,_true>_>_>,_boost::intrusive::constant_time_size<false>,_boost::intrusive::base_hook<boost::intrusive::list_base_hook<boost::intrusive::tag<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)8,_true,_false,_true>_>::Matrix_row_tag>,_boost::intrusive::link_mode<(boost::intrusive::link_mode_type)2>_>_>_>,_std::allocator<boost::intrusive::list<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)8,_true,_false,_true>_>_>,_boost::intrusive::constant_time_size<false>,_boost::intrusive::base_hook<boost::intrusive::list_base_hook<boost::intrusive::tag<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)8,_true,_false,_true>_>::Matrix_row_tag>,_boost::intrusive::link_mode<(boost::intrusive::link_mode_type)2>_>_>_>_>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  local_180 = rows;
  IVar5 = local_200._0_4_;
  prVar6 = local_1f0;
  for (plVar9 = (node_ptr)
                (rows->
                super__Vector_base<boost::intrusive::list<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)8,_true,_false,_true>_>_>,_boost::intrusive::constant_time_size<false>,_boost::intrusive::base_hook<boost::intrusive::list_base_hook<boost::intrusive::tag<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)8,_true,_false,_true>_>::Matrix_row_tag>,_boost::intrusive::link_mode<(boost::intrusive::link_mode_type)2>_>_>_>,_std::allocator<boost::intrusive::list<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)8,_true,_false,_true>_>_>,_boost::intrusive::constant_time_size<false>,_boost::intrusive::base_hook<boost::intrusive::list_base_hook<boost::intrusive::tag<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)8,_true,_false,_true>_>::Matrix_row_tag>,_boost::intrusive::link_mode<(boost::intrusive::link_mode_type)2>_>_>_>_>_>
                )._M_impl.super__Vector_impl_data._M_start; plVar9 != (node_ptr)plVar3;
      plVar9 = plVar9 + 1) {
    plVar4 = (((type *)&plVar9->next_)->data_).root_plus_size_.m_header.super_node.next_;
    local_200._0_4_ = IVar5;
    local_1f0 = prVar6;
    if (plVar9 != plVar4 && plVar4 != (node_ptr)0x0) {
      plVar4 = plVar9->prev_;
      uVar1 = *(uint *)&plVar4[3].next_;
      if ((uVar1 < 6) && ((0x2bU >> (uVar1 & 0x1f) & 1) != 0)) {
        local_120 = 
        "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_column_tests.h"
        ;
        local_118 = "";
        local_130 = &boost::unit_test::basic_cstring<char_const>::null;
        local_128 = &boost::unit_test::basic_cstring<char_const>::null;
        boost::unit_test::unit_test_log_t::set_checkpoint
                  (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_120,0x215);
        local_240 = local_240 & 0xffffffffffffff00;
        local_248 = &PTR__lazy_ostream_0020e440;
        sStack_238.pi_ = (sp_counted_base *)&boost::unit_test::lazy_ostream::inst;
        local_230 = (undefined4 **)0x1d01b2;
        iVar2 = *(int *)&plVar4[-1].prev_;
        local_298 = (undefined4 *)CONCAT44(local_298._4_4_,iVar2);
        local_2a0 = (undefined *)CONCAT44(local_2a0._4_4_,6);
        local_288 = (undefined **)CONCAT71(local_288._1_7_,iVar2 == 6);
        local_280 = (char *)0x0;
        sStack_278.pi_ = (sp_counted_base *)0x0;
        local_228 = 
        "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_column_tests.h"
        ;
        local_220 = "";
        local_210._0_8_ = &local_298;
        local_1c0._8_8_ = local_1c0._8_8_ & 0xffffffffffffff00;
        local_1c0._0_8_ = &PTR__lazy_ostream_0020e940;
        local_1b0 = (node_ptr)&boost::unit_test::lazy_ostream::inst;
        uStack_1a8 = (Intrusive_set_column<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)8,_true,_false,_true>_>_>
                      *)local_210;
        local_290 = &local_2a0;
        local_268.traits_ =
             (bhtraits<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)8,_true,_false,_true>_>_>,_boost::intrusive::rbtree_node_traits<void_*,_false>,_(boost::intrusive::link_mode_type)1,_Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)8,_true,_false,_true>_>::Matrix_column_tag,_3U>
              *)((ulong)local_268.traits_ & 0xffffffffffffff00);
        local_268.
        super_ebo_functor_holder<Gudhi::persistence_matrix::Intrusive_set_column<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)8,_true,_false,_true>_>_>::Delete_disposer,_void,_false>
        .super_Delete_disposer.col_ = (Delete_disposer)&PTR__lazy_ostream_0020e6c0;
        local_258 = &boost::unit_test::lazy_ostream::inst;
        local_250 = &local_290;
        boost::test_tools::tt_detail::report_assertion
                  (&local_288,&local_248,&local_228,0x215,1,2,2,"entry.get_column_index()",local_1c0
                   ,"6",&local_268);
        boost::detail::shared_count::~shared_count(&sStack_278);
      }
    }
    IVar5 = local_200._0_4_;
    prVar6 = local_1f0;
  }
  local_200._0_4_ = 0;
  local_1c0._4_4_ = (undefined4)((ulong)local_1c0._0_8_ >> 0x20);
  local_1c0._0_4_ = IVar5;
  local_1a0.left_._4_4_ = 0;
  local_1a0.left_._0_4_ = red_t;
  local_1f0 = (node_ptr)0x0;
  prVar8 = prVar6;
  uStack_1a8 = (Intrusive_set_column<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)8,_true,_false,_true>_>_>
                *)CONCAT44(p_Stack_1e8._4_4_,(_Rb_tree_color)p_Stack_1e8);
  if (prVar6 == (node_ptr)0x0) {
    prVar8 = &local_1a0;
    uStack_1a8 = (Intrusive_set_column<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)8,_true,_false,_true>_>_>
                  *)&local_1b0;
  }
  p_Stack_1e8 = (_Base_ptr)&local_1f0;
  prVar8->parent_ = (node_ptr)&local_1b0;
  local_1a0.right_._0_4_ = (undefined4)local_1d0;
  local_1d0._4_4_ = (undefined4)((ulong)local_1d0 >> 0x20);
  local_1a0.right_._4_4_ = local_1d0._4_4_;
  local_1a0.color_ = (color)pEStack_1c8;
  pEStack_1c8._4_4_ = (undefined4)((ulong)pEStack_1c8 >> 0x20);
  local_1a0._28_4_ = pEStack_1c8._4_4_;
  local_1d0 = (_Base_ptr)0x0;
  pEStack_1c8 = (Entry_constructor *)0x0;
  local_40 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_column_tests.h"
  ;
  local_38 = "";
  local_50 = &boost::unit_test::basic_cstring<char_const>::null;
  local_48 = &boost::unit_test::basic_cstring<char_const>::null;
  local_1b0 = prVar6;
  p_Stack_1e0 = p_Stack_1e8;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_40,0x21c);
  local_280 = (char *)((ulong)local_280 & 0xffffffffffffff00);
  local_288 = &PTR__lazy_ostream_0020e440;
  sStack_278.pi_ = (sp_counted_base *)&boost::unit_test::lazy_ostream::inst;
  local_270 = "";
  local_268.
  super_ebo_functor_holder<Gudhi::persistence_matrix::Intrusive_set_column<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)8,_true,_false,_true>_>_>::Delete_disposer,_void,_false>
  .super_Delete_disposer.col_ = (Delete_disposer)(Delete_disposer)&local_1b0;
  local_2a0 = (undefined *)
              boost::intrusive::
              bstree_algorithms<boost::intrusive::rbtree_node_traits<void_*,_false>_>::size
                        ((const_node_ptr *)&local_268);
  local_290 = &local_2a0;
  local_298 = &local_2a4;
  local_2a4 = 4;
  local_220 = (char *)0x0;
  sStack_218.pi_ = (sp_counted_base *)0x0;
  local_210._0_8_ =
       "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_column_tests.h"
  ;
  local_210._8_8_ = "";
  local_250 = &local_290;
  local_268.traits_ =
       (bhtraits<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)8,_true,_false,_true>_>_>,_boost::intrusive::rbtree_node_traits<void_*,_false>,_(boost::intrusive::link_mode_type)1,_Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)8,_true,_false,_true>_>::Matrix_column_tag,_3U>
        *)((ulong)local_268.traits_ & 0xffffffffffffff00);
  local_268.
  super_ebo_functor_holder<Gudhi::persistence_matrix::Intrusive_set_column<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)8,_true,_false,_true>_>_>::Delete_disposer,_void,_false>
  .super_Delete_disposer.col_ = (Delete_disposer)&PTR__lazy_ostream_0020e400;
  local_258 = &boost::unit_test::lazy_ostream::inst;
  local_230 = &local_298;
  local_240 = local_240 & 0xffffffffffffff00;
  local_248 = &PTR__lazy_ostream_0020e6c0;
  sStack_238.pi_ = (sp_counted_base *)&boost::unit_test::lazy_ostream::inst;
  local_228._0_1_ = local_2a0 == (undefined *)0x4;
  boost::test_tools::tt_detail::report_assertion
            (&local_228,&local_288,local_210,0x21c,1,2,2,"moveCol.size()",&local_268,"4",&local_248)
  ;
  boost::detail::shared_count::~shared_count(&sStack_218);
  local_60 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_column_tests.h"
  ;
  local_58 = "";
  local_70 = &boost::unit_test::basic_cstring<char_const>::null;
  local_68 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_60,0x21d);
  local_268.
  super_ebo_functor_holder<Gudhi::persistence_matrix::Intrusive_set_column<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)8,_true,_false,_true>_>_>::Delete_disposer,_void,_false>
  .super_Delete_disposer.col_ = (Delete_disposer)&local_1f0;
  local_280 = (char *)((ulong)local_280 & 0xffffffffffffff00);
  local_288 = &PTR__lazy_ostream_0020e440;
  sStack_278.pi_ = (sp_counted_base *)&boost::unit_test::lazy_ostream::inst;
  local_270 = "";
  local_2a0 = (undefined *)
              boost::intrusive::
              bstree_algorithms<boost::intrusive::rbtree_node_traits<void_*,_false>_>::size
                        ((const_node_ptr *)&local_268);
  local_2a4 = 0;
  local_228 = (char *)CONCAT71(local_228._1_7_,local_2a0 == (undefined *)0x0);
  local_220 = (char *)0x0;
  sStack_218.pi_ = (sp_counted_base *)0x0;
  local_210._0_8_ =
       "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_column_tests.h"
  ;
  local_210._8_8_ = "";
  local_290 = &local_2a0;
  local_268.traits_ =
       (bhtraits<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)8,_true,_false,_true>_>_>,_boost::intrusive::rbtree_node_traits<void_*,_false>,_(boost::intrusive::link_mode_type)1,_Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)8,_true,_false,_true>_>::Matrix_column_tag,_3U>
        *)((ulong)local_268.traits_ & 0xffffffffffffff00);
  local_268.
  super_ebo_functor_holder<Gudhi::persistence_matrix::Intrusive_set_column<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)8,_true,_false,_true>_>_>::Delete_disposer,_void,_false>
  .super_Delete_disposer.col_ = (Delete_disposer)&PTR__lazy_ostream_0020e400;
  local_258 = &boost::unit_test::lazy_ostream::inst;
  local_250 = &local_290;
  local_298 = &local_2a4;
  local_240 = local_240 & 0xffffffffffffff00;
  local_248 = &PTR__lazy_ostream_0020e6c0;
  sStack_238.pi_ = (sp_counted_base *)&boost::unit_test::lazy_ostream::inst;
  local_230 = &local_298;
  boost::test_tools::tt_detail::report_assertion
            (&local_228,&local_288,local_210,0x21d,1,2,2,"col.size()",&local_268,"0",&local_248);
  boost::detail::shared_count::~shared_count(&sStack_218);
  local_80 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_column_tests.h"
  ;
  local_78 = "";
  local_90 = &boost::unit_test::basic_cstring<char_const>::null;
  local_88 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_80,0x21e);
  bVar7 = Gudhi::persistence_matrix::operator==
                    ((local_178->
                     super__Vector_base<Gudhi::persistence_matrix::Intrusive_set_column<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)8,_true,_false,_true>_>_>,_std::allocator<Gudhi::persistence_matrix::Intrusive_set_column<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)8,_true,_false,_true>_>_>_>_>
                     )._M_impl.super__Vector_impl_data._M_start,
                     (Intrusive_set_column<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)8,_true,_false,_true>_>_>
                      *)local_1c0);
  local_248 = (undefined **)CONCAT71(local_248._1_7_,bVar7);
  local_240 = 0;
  sStack_238.pi_ = (sp_counted_base *)0x0;
  local_288 = (undefined **)0x1dae98;
  local_280 = "";
  local_268.traits_ =
       (bhtraits<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)8,_true,_false,_true>_>_>,_boost::intrusive::rbtree_node_traits<void_*,_false>,_(boost::intrusive::link_mode_type)1,_Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)8,_true,_false,_true>_>::Matrix_column_tag,_3U>
        *)((ulong)local_268.traits_ & 0xffffffffffffff00);
  local_268.
  super_ebo_functor_holder<Gudhi::persistence_matrix::Intrusive_set_column<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)8,_true,_false,_true>_>_>::Delete_disposer,_void,_false>
  .super_Delete_disposer.col_ = (Delete_disposer)&PTR__lazy_ostream_0020e388;
  local_258 = &boost::unit_test::lazy_ostream::inst;
  local_a0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_column_tests.h"
  ;
  local_98 = "";
  local_250 = &local_288;
  boost::test_tools::tt_detail::report_assertion();
  boost::detail::shared_count::~shared_count(&sStack_238);
  plVar3 = (local_180->
           super__Vector_base<boost::intrusive::list<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)8,_true,_false,_true>_>_>,_boost::intrusive::constant_time_size<false>,_boost::intrusive::base_hook<boost::intrusive::list_base_hook<boost::intrusive::tag<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)8,_true,_false,_true>_>::Matrix_row_tag>,_boost::intrusive::link_mode<(boost::intrusive::link_mode_type)2>_>_>_>,_std::allocator<boost::intrusive::list<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)8,_true,_false,_true>_>_>,_boost::intrusive::constant_time_size<false>,_boost::intrusive::base_hook<boost::intrusive::list_base_hook<boost::intrusive::tag<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)8,_true,_false,_true>_>::Matrix_row_tag>,_boost::intrusive::link_mode<(boost::intrusive::link_mode_type)2>_>_>_>_>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  for (plVar9 = (node_ptr)
                (local_180->
                super__Vector_base<boost::intrusive::list<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)8,_true,_false,_true>_>_>,_boost::intrusive::constant_time_size<false>,_boost::intrusive::base_hook<boost::intrusive::list_base_hook<boost::intrusive::tag<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)8,_true,_false,_true>_>::Matrix_row_tag>,_boost::intrusive::link_mode<(boost::intrusive::link_mode_type)2>_>_>_>,_std::allocator<boost::intrusive::list<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)8,_true,_false,_true>_>_>,_boost::intrusive::constant_time_size<false>,_boost::intrusive::base_hook<boost::intrusive::list_base_hook<boost::intrusive::tag<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)8,_true,_false,_true>_>::Matrix_row_tag>,_boost::intrusive::link_mode<(boost::intrusive::link_mode_type)2>_>_>_>_>_>
                )._M_impl.super__Vector_impl_data._M_start; plVar9 != (node_ptr)plVar3;
      plVar9 = plVar9 + 1) {
    plVar4 = (((type *)&plVar9->next_)->data_).root_plus_size_.m_header.super_node.next_;
    if (plVar9 != plVar4 && plVar4 != (node_ptr)0x0) {
      plVar4 = plVar9->prev_;
      uVar1 = *(uint *)&plVar4[3].next_;
      if ((uVar1 < 6) && ((0x2bU >> (uVar1 & 0x1f) & 1) != 0)) {
        local_140 = 
        "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_column_tests.h"
        ;
        local_138 = "";
        local_150 = &boost::unit_test::basic_cstring<char_const>::null;
        local_148 = &boost::unit_test::basic_cstring<char_const>::null;
        boost::unit_test::unit_test_log_t::set_checkpoint
                  (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_140,0x22d,
                   &local_150);
        local_280 = (char *)((ulong)local_280 & 0xffffffffffffff00);
        local_288 = &PTR__lazy_ostream_0020e440;
        sStack_278.pi_ = (sp_counted_base *)&boost::unit_test::lazy_ostream::inst;
        local_270 = "";
        iVar2 = *(int *)&plVar4[-1].prev_;
        local_2a0 = (undefined *)CONCAT44(local_2a0._4_4_,iVar2);
        local_2a4 = 6;
        local_228 = (char *)CONCAT71(local_228._1_7_,iVar2 == 6);
        local_220 = (char *)0x0;
        sStack_218.pi_ = (sp_counted_base *)0x0;
        local_210._0_8_ =
             "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_column_tests.h"
        ;
        local_210._8_8_ = "";
        local_290 = &local_2a0;
        local_268.traits_ =
             (bhtraits<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)8,_true,_false,_true>_>_>,_boost::intrusive::rbtree_node_traits<void_*,_false>,_(boost::intrusive::link_mode_type)1,_Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)8,_true,_false,_true>_>::Matrix_column_tag,_3U>
              *)((ulong)local_268.traits_ & 0xffffffffffffff00);
        local_268.
        super_ebo_functor_holder<Gudhi::persistence_matrix::Intrusive_set_column<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)8,_true,_false,_true>_>_>::Delete_disposer,_void,_false>
        .super_Delete_disposer.col_ = (Delete_disposer)&PTR__lazy_ostream_0020e940;
        local_258 = &boost::unit_test::lazy_ostream::inst;
        local_250 = &local_290;
        local_298 = &local_2a4;
        local_240 = local_240 & 0xffffffffffffff00;
        local_248 = &PTR__lazy_ostream_0020e6c0;
        sStack_238.pi_ = (sp_counted_base *)&boost::unit_test::lazy_ostream::inst;
        local_230 = &local_298;
        boost::test_tools::tt_detail::report_assertion
                  (&local_228,&local_288,local_210,0x22d,1,2,2,"entry.get_column_index()",&local_268
                   ,"6",&local_248);
        boost::detail::shared_count::~shared_count(&sStack_218);
      }
    }
  }
  Gudhi::persistence_matrix::swap
            ((Intrusive_set_column<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)8,_true,_false,_true>_>_>
              *)local_200,
             (Intrusive_set_column<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)8,_true,_false,_true>_>_>
              *)local_1c0);
  local_b0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_column_tests.h"
  ;
  local_a8 = "";
  local_c0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_b8 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_b0,0x234);
  local_280 = (char *)((ulong)local_280 & 0xffffffffffffff00);
  local_288 = &PTR__lazy_ostream_0020e440;
  sStack_278.pi_ = (sp_counted_base *)&boost::unit_test::lazy_ostream::inst;
  local_270 = "";
  local_268.
  super_ebo_functor_holder<Gudhi::persistence_matrix::Intrusive_set_column<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)8,_true,_false,_true>_>_>::Delete_disposer,_void,_false>
  .super_Delete_disposer.col_ =
       (Delete_disposer)
       (Intrusive_set_column<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)8,_true,_false,_true>_>_>
        *)&local_1b0;
  local_2a0 = (undefined *)
              boost::intrusive::
              bstree_algorithms<boost::intrusive::rbtree_node_traits<void_*,_false>_>::size
                        ((const_node_ptr *)&local_268);
  local_2a4 = 0;
  local_220 = (char *)0x0;
  sStack_218.pi_ = (sp_counted_base *)0x0;
  local_210._0_8_ =
       "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_column_tests.h"
  ;
  local_210._8_8_ = "";
  local_290 = &local_2a0;
  local_268.traits_ =
       (bhtraits<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)8,_true,_false,_true>_>_>,_boost::intrusive::rbtree_node_traits<void_*,_false>,_(boost::intrusive::link_mode_type)1,_Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)8,_true,_false,_true>_>::Matrix_column_tag,_3U>
        *)((ulong)local_268.traits_ & 0xffffffffffffff00);
  local_268.
  super_ebo_functor_holder<Gudhi::persistence_matrix::Intrusive_set_column<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)8,_true,_false,_true>_>_>::Delete_disposer,_void,_false>
  .super_Delete_disposer.col_ = (Delete_disposer)&PTR__lazy_ostream_0020e400;
  local_258 = &boost::unit_test::lazy_ostream::inst;
  local_250 = &local_290;
  local_298 = &local_2a4;
  local_240 = local_240 & 0xffffffffffffff00;
  local_248 = &PTR__lazy_ostream_0020e6c0;
  sStack_238.pi_ = (sp_counted_base *)&boost::unit_test::lazy_ostream::inst;
  local_230 = &local_298;
  local_228._0_1_ = local_2a0 == (undefined *)0x0;
  boost::test_tools::tt_detail::report_assertion
            (&local_228,&local_288,local_210,0x234,1,2,2,"moveCol.size()",&local_268,"0",&local_248)
  ;
  boost::detail::shared_count::~shared_count(&sStack_218);
  local_d0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_column_tests.h"
  ;
  local_c8 = "";
  local_e0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_d8 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_d0,0x235);
  local_280 = (char *)((ulong)local_280 & 0xffffffffffffff00);
  local_288 = &PTR__lazy_ostream_0020e440;
  sStack_278.pi_ = (sp_counted_base *)&boost::unit_test::lazy_ostream::inst;
  local_270 = "";
  local_268.
  super_ebo_functor_holder<Gudhi::persistence_matrix::Intrusive_set_column<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)8,_true,_false,_true>_>_>::Delete_disposer,_void,_false>
  .super_Delete_disposer.col_ =
       (Delete_disposer)
       (Intrusive_set_column<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)8,_true,_false,_true>_>_>
        *)&local_1f0;
  local_2a0 = (undefined *)
              boost::intrusive::
              bstree_algorithms<boost::intrusive::rbtree_node_traits<void_*,_false>_>::size
                        ((const_node_ptr *)&local_268);
  local_2a4 = 4;
  local_228 = (char *)CONCAT71(local_228._1_7_,local_2a0 == (undefined *)0x4);
  local_220 = (char *)0x0;
  sStack_218.pi_ = (sp_counted_base *)0x0;
  local_210._0_8_ =
       "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_column_tests.h"
  ;
  local_210._8_8_ = "";
  local_290 = &local_2a0;
  local_268.traits_ =
       (bhtraits<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)8,_true,_false,_true>_>_>,_boost::intrusive::rbtree_node_traits<void_*,_false>,_(boost::intrusive::link_mode_type)1,_Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)8,_true,_false,_true>_>::Matrix_column_tag,_3U>
        *)((ulong)local_268.traits_ & 0xffffffffffffff00);
  local_268.
  super_ebo_functor_holder<Gudhi::persistence_matrix::Intrusive_set_column<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)8,_true,_false,_true>_>_>::Delete_disposer,_void,_false>
  .super_Delete_disposer.col_ = (Delete_disposer)&PTR__lazy_ostream_0020e400;
  local_258 = &boost::unit_test::lazy_ostream::inst;
  local_250 = &local_290;
  local_298 = &local_2a4;
  local_240 = local_240 & 0xffffffffffffff00;
  local_248 = &PTR__lazy_ostream_0020e6c0;
  sStack_238.pi_ = (sp_counted_base *)&boost::unit_test::lazy_ostream::inst;
  local_230 = &local_298;
  boost::test_tools::tt_detail::report_assertion
            (&local_228,&local_288,local_210,0x235,1,2,2,"col.size()",&local_268,"4",&local_248);
  boost::detail::shared_count::~shared_count(&sStack_218);
  local_f0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_column_tests.h"
  ;
  local_e8 = "";
  local_100 = &boost::unit_test::basic_cstring<char_const>::null;
  local_f8 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_f0,0x236);
  bVar7 = Gudhi::persistence_matrix::operator==
                    ((local_178->
                     super__Vector_base<Gudhi::persistence_matrix::Intrusive_set_column<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)8,_true,_false,_true>_>_>,_std::allocator<Gudhi::persistence_matrix::Intrusive_set_column<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)8,_true,_false,_true>_>_>_>_>
                     )._M_impl.super__Vector_impl_data._M_start,
                     (Intrusive_set_column<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)8,_true,_false,_true>_>_>
                      *)local_200);
  local_248 = (undefined **)CONCAT71(local_248._1_7_,bVar7);
  local_240 = 0;
  sStack_238.pi_ = (sp_counted_base *)0x0;
  local_288 = (undefined **)0x1daead;
  local_280 = "";
  local_268.traits_ =
       (bhtraits<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)8,_true,_false,_true>_>_>,_boost::intrusive::rbtree_node_traits<void_*,_false>,_(boost::intrusive::link_mode_type)1,_Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)8,_true,_false,_true>_>::Matrix_column_tag,_3U>
        *)((ulong)local_268.traits_ & 0xffffffffffffff00);
  local_268.
  super_ebo_functor_holder<Gudhi::persistence_matrix::Intrusive_set_column<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)8,_true,_false,_true>_>_>::Delete_disposer,_void,_false>
  .super_Delete_disposer.col_ = (Delete_disposer)&PTR__lazy_ostream_0020e388;
  local_258 = &boost::unit_test::lazy_ostream::inst;
  local_110 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_column_tests.h"
  ;
  local_108 = "";
  local_250 = &local_288;
  boost::test_tools::tt_detail::report_assertion();
  boost::detail::shared_count::~shared_count(&sStack_238);
  plVar3 = (local_180->
           super__Vector_base<boost::intrusive::list<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)8,_true,_false,_true>_>_>,_boost::intrusive::constant_time_size<false>,_boost::intrusive::base_hook<boost::intrusive::list_base_hook<boost::intrusive::tag<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)8,_true,_false,_true>_>::Matrix_row_tag>,_boost::intrusive::link_mode<(boost::intrusive::link_mode_type)2>_>_>_>,_std::allocator<boost::intrusive::list<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)8,_true,_false,_true>_>_>,_boost::intrusive::constant_time_size<false>,_boost::intrusive::base_hook<boost::intrusive::list_base_hook<boost::intrusive::tag<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)8,_true,_false,_true>_>::Matrix_row_tag>,_boost::intrusive::link_mode<(boost::intrusive::link_mode_type)2>_>_>_>_>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  for (plVar9 = (node_ptr)
                (local_180->
                super__Vector_base<boost::intrusive::list<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)8,_true,_false,_true>_>_>,_boost::intrusive::constant_time_size<false>,_boost::intrusive::base_hook<boost::intrusive::list_base_hook<boost::intrusive::tag<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)8,_true,_false,_true>_>::Matrix_row_tag>,_boost::intrusive::link_mode<(boost::intrusive::link_mode_type)2>_>_>_>,_std::allocator<boost::intrusive::list<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)8,_true,_false,_true>_>_>,_boost::intrusive::constant_time_size<false>,_boost::intrusive::base_hook<boost::intrusive::list_base_hook<boost::intrusive::tag<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)8,_true,_false,_true>_>::Matrix_row_tag>,_boost::intrusive::link_mode<(boost::intrusive::link_mode_type)2>_>_>_>_>_>
                )._M_impl.super__Vector_impl_data._M_start; plVar9 != (node_ptr)plVar3;
      plVar9 = plVar9 + 1) {
    plVar4 = (((type *)&plVar9->next_)->data_).root_plus_size_.m_header.super_node.next_;
    if (plVar9 != plVar4 && plVar4 != (node_ptr)0x0) {
      plVar4 = plVar9->prev_;
      uVar1 = *(uint *)&plVar4[3].next_;
      if ((uVar1 < 6) && ((0x2bU >> (uVar1 & 0x1f) & 1) != 0)) {
        local_160 = 
        "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_column_tests.h"
        ;
        local_158 = "";
        local_170 = &boost::unit_test::basic_cstring<char_const>::null;
        local_168 = &boost::unit_test::basic_cstring<char_const>::null;
        boost::unit_test::unit_test_log_t::set_checkpoint
                  (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_160,0x245,
                   &local_170);
        local_280 = (char *)((ulong)local_280 & 0xffffffffffffff00);
        local_288 = &PTR__lazy_ostream_0020e440;
        sStack_278.pi_ = (sp_counted_base *)&boost::unit_test::lazy_ostream::inst;
        local_270 = "";
        iVar2 = *(int *)&plVar4[-1].prev_;
        local_2a0 = (undefined *)CONCAT44(local_2a0._4_4_,iVar2);
        local_2a4 = 6;
        local_228 = (char *)CONCAT71(local_228._1_7_,iVar2 == 6);
        local_220 = (char *)0x0;
        sStack_218.pi_ = (sp_counted_base *)0x0;
        local_210._0_8_ =
             "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_column_tests.h"
        ;
        local_210._8_8_ = "";
        local_290 = &local_2a0;
        local_268.traits_ =
             (bhtraits<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)8,_true,_false,_true>_>_>,_boost::intrusive::rbtree_node_traits<void_*,_false>,_(boost::intrusive::link_mode_type)1,_Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)8,_true,_false,_true>_>::Matrix_column_tag,_3U>
              *)((ulong)local_268.traits_ & 0xffffffffffffff00);
        local_268.
        super_ebo_functor_holder<Gudhi::persistence_matrix::Intrusive_set_column<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)8,_true,_false,_true>_>_>::Delete_disposer,_void,_false>
        .super_Delete_disposer.col_ = (Delete_disposer)&PTR__lazy_ostream_0020e940;
        local_258 = &boost::unit_test::lazy_ostream::inst;
        local_250 = &local_290;
        local_298 = &local_2a4;
        local_240 = local_240 & 0xffffffffffffff00;
        local_248 = &PTR__lazy_ostream_0020e6c0;
        sStack_238.pi_ = (sp_counted_base *)&boost::unit_test::lazy_ostream::inst;
        local_230 = &local_298;
        boost::test_tools::tt_detail::report_assertion
                  (&local_228,&local_288,local_210,0x245,1,2,2,"entry.get_column_index()",&local_268
                   ,"6",&local_248);
        boost::detail::shared_count::~shared_count(&sStack_218);
      }
    }
  }
  if (local_1b0 != (node_ptr)0x0) {
    local_268.
    super_ebo_functor_holder<Gudhi::persistence_matrix::Intrusive_set_column<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)8,_true,_false,_true>_>_>::Delete_disposer,_void,_false>
    .super_Delete_disposer.col_ = (Delete_disposer)local_1c0;
    local_268.traits_ =
         (bhtraits<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)8,_true,_false,_true>_>_>,_boost::intrusive::rbtree_node_traits<void_*,_false>,_(boost::intrusive::link_mode_type)1,_Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)8,_true,_false,_true>_>::Matrix_column_tag,_3U>
          *)&local_1b0;
    boost::intrusive::bstree_algorithms<boost::intrusive::rbtree_node_traits<void*,false>>::
    dispose_subtree<boost::intrusive::detail::node_disposer<Gudhi::persistence_matrix::Intrusive_set_column<Column_mini_matrix<Base_col_options<true,(Gudhi::persistence_matrix::Column_types)8,true,false,true>>>::Delete_disposer,boost::intrusive::bhtraits<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,(Gudhi::persistence_matrix::Column_types)8,true,false,true>>>,boost::intrusive::rbtree_node_traits<void*,false>,(boost::intrusive::link_mode_type)1,Column_mini_matrix<Base_col_options<true,(Gudhi::persistence_matrix::Column_types)8,true,false,true>>::Matrix_column_tag,3u>,(boost::intrusive::algo_types)5>>
              (local_1b0,&local_268);
  }
  local_1a0.parent_._0_4_ = 0;
  local_1a0.parent_._4_4_ = 0;
  local_1a0.left_._0_4_ = red_t;
  local_1b0 = (node_ptr)0x0;
  uStack_1a8._0_4_ = 0;
  uStack_1a8._4_4_ = 0;
  if (local_1f0 != (node_ptr)0x0) {
    local_1c0._0_8_ = local_200;
    local_1c0._8_8_ =
         (bhtraits<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)8,_true,_false,_true>_>_>,_boost::intrusive::rbtree_node_traits<void_*,_false>,_(boost::intrusive::link_mode_type)1,_Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)8,_true,_false,_true>_>::Matrix_column_tag,_3U>
          *)&local_1f0;
    boost::intrusive::bstree_algorithms<boost::intrusive::rbtree_node_traits<void*,false>>::
    dispose_subtree<boost::intrusive::detail::node_disposer<Gudhi::persistence_matrix::Intrusive_set_column<Column_mini_matrix<Base_col_options<true,(Gudhi::persistence_matrix::Column_types)8,true,false,true>>>::Delete_disposer,boost::intrusive::bhtraits<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,(Gudhi::persistence_matrix::Column_types)8,true,false,true>>>,boost::intrusive::rbtree_node_traits<void*,false>,(boost::intrusive::link_mode_type)1,Column_mini_matrix<Base_col_options<true,(Gudhi::persistence_matrix::Column_types)8,true,false,true>>::Matrix_column_tag,3u>,(boost::intrusive::algo_types)5>>
              (local_1f0,
               (node_disposer<Gudhi::persistence_matrix::Intrusive_set_column<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)8,_true,_false,_true>_>_>::Delete_disposer,_boost::intrusive::bhtraits<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)8,_true,_false,_true>_>_>,_boost::intrusive::rbtree_node_traits<void_*,_false>,_(boost::intrusive::link_mode_type)1,_Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)8,_true,_false,_true>_>::Matrix_column_tag,_3U>,_(boost::intrusive::algo_types)5>
                *)local_1c0);
  }
  return;
}

Assistant:

void column_test_row_access_constructors(std::vector<Column>& matrix, Row_container& rows) {
  test_matrix_equality<Column>(build_rows<Column>(), get_ordered_rows(matrix));
  test_matrix_equality<Column>(build_column_values<Column>(), get_ordered_column_contents(matrix));

  Column col(matrix[0], 6, &rows);
  for (auto& r : rows) {
    if constexpr (Column::Master::Option_list::has_removable_rows) {
      if (!r.second.empty()) {
        auto& entry = *r.second.rbegin();
        if (entry.get_row_index() == 0 || entry.get_row_index() == 1 || entry.get_row_index() == 3 ||
            entry.get_row_index() == 5) {
          BOOST_CHECK_EQUAL(entry.get_column_index(), 6);
        }
      }
    } else {
      if (!r.empty()) {
        auto& entry = *r.rbegin();
        if (entry.get_row_index() == 0 || entry.get_row_index() == 1 || entry.get_row_index() == 3 ||
            entry.get_row_index() == 5) {
          BOOST_CHECK_EQUAL(entry.get_column_index(), 6);
        }
      }
    }
  }

  Column moveCol(std::move(col));
  BOOST_CHECK_EQUAL(moveCol.size(), 4);
  BOOST_CHECK_EQUAL(col.size(), 0);
  BOOST_CHECK(matrix[0] == moveCol);
  for (auto& r : rows) {
    if constexpr (Column::Master::Option_list::has_removable_rows) {
      if (!r.second.empty()) {
        auto& entry = *r.second.rbegin();
        if (entry.get_row_index() == 0 || entry.get_row_index() == 1 || entry.get_row_index() == 3 ||
            entry.get_row_index() == 5) {
          BOOST_CHECK_EQUAL(entry.get_column_index(), 6);
        }
      }
    } else {
      if (!r.empty()) {
        auto& entry = *r.rbegin();
        if (entry.get_row_index() == 0 || entry.get_row_index() == 1 || entry.get_row_index() == 3 ||
            entry.get_row_index() == 5) {
          BOOST_CHECK_EQUAL(entry.get_column_index(), 6);
        }
      }
    }
  }

  swap(col, moveCol);
  BOOST_CHECK_EQUAL(moveCol.size(), 0);
  BOOST_CHECK_EQUAL(col.size(), 4);
  BOOST_CHECK(matrix[0] == col);
  for (auto& r : rows) {
    if constexpr (Column::Master::Option_list::has_removable_rows) {
      if (!r.second.empty()) {
        auto& entry = *r.second.rbegin();
        if (entry.get_row_index() == 0 || entry.get_row_index() == 1 || entry.get_row_index() == 3 ||
            entry.get_row_index() == 5) {
          BOOST_CHECK_EQUAL(entry.get_column_index(), 6);
        }
      }
    } else {
      if (!r.empty()) {
        auto& entry = *r.rbegin();
        if (entry.get_row_index() == 0 || entry.get_row_index() == 1 || entry.get_row_index() == 3 ||
            entry.get_row_index() == 5) {
          BOOST_CHECK_EQUAL(entry.get_column_index(), 6);
        }
      }
    }
  }
}